

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_req_make(httpreq **preq,char *method,size_t m_len,char *scheme,size_t s_len,
                           char *authority,size_t a_len,char *path,size_t p_len)

{
  bool bVar1;
  httpreq *req;
  char *pcVar2;
  CURLcode CVar3;
  
  req = (httpreq *)(*Curl_ccalloc)(1,m_len + 0x90);
  if (req == (httpreq *)0x0) {
LAB_0013a706:
    bVar1 = true;
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    memcpy(req->method,method,m_len);
    if (scheme != (char *)0x0) {
      pcVar2 = (char *)Curl_memdup0(scheme,s_len);
      req->scheme = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_0013a706;
    }
    bVar1 = true;
    CVar3 = CURLE_OUT_OF_MEMORY;
    if (authority != (char *)0x0) {
      pcVar2 = (char *)Curl_memdup0(authority,a_len);
      req->authority = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_0013a70d;
    }
    if (path != (char *)0x0) {
      pcVar2 = (char *)Curl_memdup0(path,p_len);
      req->path = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_0013a70d;
    }
    bVar1 = false;
    Curl_dynhds_init((dynhds *)req,0,0x100000);
    Curl_dynhds_init(&req->trailers,0,0x100000);
    CVar3 = CURLE_OK;
  }
LAB_0013a70d:
  if (!(bool)(bVar1 ^ 1U | req == (httpreq *)0x0)) {
    Curl_http_req_free(req);
  }
  if (bVar1) {
    req = (httpreq *)0x0;
  }
  *preq = req;
  return CVar3;
}

Assistant:

CURLcode Curl_http_req_make(struct httpreq **preq,
                            const char *method, size_t m_len,
                            const char *scheme, size_t s_len,
                            const char *authority, size_t a_len,
                            const char *path, size_t p_len)
{
  struct httpreq *req;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  DEBUGASSERT(method && m_len);

  req = calloc(1, sizeof(*req) + m_len);
  if(!req)
    goto out;
  memcpy(req->method, method, m_len);
  if(scheme) {
    req->scheme = Curl_memdup0(scheme, s_len);
    if(!req->scheme)
      goto out;
  }
  if(authority) {
    req->authority = Curl_memdup0(authority, a_len);
    if(!req->authority)
      goto out;
  }
  if(path) {
    req->path = Curl_memdup0(path, p_len);
    if(!req->path)
      goto out;
  }
  Curl_dynhds_init(&req->headers, 0, DYN_HTTP_REQUEST);
  Curl_dynhds_init(&req->trailers, 0, DYN_HTTP_REQUEST);
  result = CURLE_OK;

out:
  if(result && req)
    Curl_http_req_free(req);
  *preq = result ? NULL : req;
  return result;
}